

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O1

void __thiscall QMdi::ControlContainer::updateWindowIcon(ControlContainer *this,QIcon *windowIcon)

{
  Data *pDVar1;
  
  pDVar1 = (this->m_menuLabel).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this->m_menuLabel).wp.value != (QObject *)0x0)) {
    QWidget::setWindowIcon((QWidget *)(this->m_menuLabel).wp.value,windowIcon);
    return;
  }
  return;
}

Assistant:

bool isNull() const noexcept { return d == nullptr || d->strongref.loadRelaxed() == 0 || value == nullptr; }